

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  int iVar21;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  void *pvVar25;
  void *pvVar26;
  long lVar27;
  uint *puVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  void *pvVar32;
  long lVar33;
  undefined4 uVar34;
  ulong uVar35;
  void *pvVar36;
  long lVar37;
  void *pvVar38;
  void *pvVar39;
  int k;
  long lVar40;
  void *pvVar41;
  short tmp [6] [3];
  ulong local_120;
  void *local_110;
  void *local_108;
  void *local_100;
  undefined1 local_a8 [64];
  size_t local_68;
  short asStack_5c [3];
  uint auStack_56 [9];
  
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar39 = kernel->data;
    local_110 = (void *)local_a8._0_8_;
    local_120 = 0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_120;
        uVar20 = 0;
        pvVar24 = local_110;
        do {
          lVar40 = uVar20 * 9;
          cVar1 = *(char *)((long)pvVar39 + lVar40 + iVar18);
          cVar2 = *(char *)((long)pvVar39 + lVar40 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)pvVar39 + lVar40 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)pvVar39 + lVar40 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)pvVar39 + lVar40 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)pvVar39 + lVar40 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)pvVar39 + lVar40 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)pvVar39 + lVar40 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)pvVar39 + lVar40 + (long)iVar18 + 8);
          lVar40 = 4;
          do {
            sVar10 = *(short *)(&UNK_005185bc + lVar40);
            sVar11 = *(short *)(&UNK_005185be + lVar40);
            sVar12 = *(short *)((long)&DAT_005185c0 + lVar40);
            *(short *)((long)asStack_5c + lVar40) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1
            ;
            *(short *)((long)asStack_5c + lVar40 + 2) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar40 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar40 = lVar40 + 6;
          } while (lVar40 != 0x28);
          lVar40 = 0;
          pvVar19 = pvVar24;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar40 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar40 * 6);
            puVar28 = &DAT_005185c2;
            lVar30 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar28),ZEXT416(uVar13));
              uVar34 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar30 * 2) =
                   (short)uVar34 + auVar16._0_2_ + *(short *)((long)puVar28 + -2) * sVar10;
              lVar30 = lVar30 + 1;
              puVar28 = (uint *)((long)puVar28 + 6);
            } while (lVar30 != 6);
            lVar40 = lVar40 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar40 != 6);
          uVar20 = uVar20 + 1;
          pvVar24 = (void *)((long)pvVar24 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
        } while (uVar20 != (uint)inch);
      }
      local_120 = local_120 + 1;
      local_110 = (void *)((long)local_110 + local_68 * local_a8._16_8_);
    } while (local_120 != (uint)outch);
  }
  iVar18 = inch + 7;
  if (-1 < inch) {
    iVar18 = inch;
  }
  iVar21 = outch + 3;
  if (-1 < outch) {
    iVar21 = outch;
  }
  Mat::create(kernel_tm,iVar18 >> 3,0x24,iVar21 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    lVar31 = local_68 * local_a8._16_8_;
    iVar18 = kernel_tm->w;
    pvVar24 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    pvVar25 = (void *)(lVar31 * 3 + local_a8._0_8_);
    lVar40 = lVar31 * 4;
    lVar30 = (long)(int)local_a8._44_4_ * local_a8._16_8_ * 8;
    pvVar39 = (void *)(local_a8._0_8_ + lVar31 * 2);
    pvVar32 = (void *)(lVar31 + local_a8._0_8_);
    uVar20 = 0;
    pvVar19 = (void *)local_a8._0_8_;
    do {
      lVar31 = 0;
      pvVar26 = pvVar25;
      pvVar38 = pvVar39;
      local_108 = pvVar32;
      local_100 = pvVar19;
      do {
        if (7 < inch) {
          lVar29 = (long)pvVar24 + (long)iVar18 * sVar14 * lVar31 + (uVar20 >> 2) * sVar15 * sVar14;
          pvVar22 = local_100;
          pvVar23 = local_108;
          lVar33 = 0;
          pvVar36 = pvVar26;
          pvVar41 = pvVar38;
          do {
            lVar37 = 0;
            lVar27 = 0;
            do {
              *(undefined2 *)(lVar29 + lVar27) = *(undefined2 *)((long)pvVar22 + lVar37);
              *(undefined2 *)(lVar29 + lVar27 + 2) = *(undefined2 *)((long)pvVar23 + lVar37);
              *(undefined2 *)(lVar29 + lVar27 + 4) = *(undefined2 *)((long)pvVar41 + lVar37);
              *(undefined2 *)(lVar29 + lVar27 + 6) = *(undefined2 *)((long)pvVar36 + lVar37);
              lVar27 = lVar27 + 8;
              lVar37 = lVar37 + (long)(int)local_a8._44_4_ * local_a8._16_8_;
            } while (lVar27 != 0x40);
            lVar27 = lVar33 + 0xf;
            pvVar36 = (void *)((long)pvVar36 + lVar30);
            pvVar41 = (void *)((long)pvVar41 + lVar30);
            pvVar23 = (void *)((long)pvVar23 + lVar30);
            pvVar22 = (void *)((long)pvVar22 + lVar30);
            lVar29 = lVar29 + 0x40;
            lVar33 = lVar33 + 8;
          } while (lVar27 < inch);
        }
        lVar31 = lVar31 + 1;
        pvVar26 = (void *)((long)pvVar26 + 2);
        pvVar38 = (void *)((long)pvVar38 + 2);
        local_108 = (void *)((long)local_108 + 2);
        local_100 = (void *)((long)local_100 + 2);
      } while (lVar31 != 0x24);
      uVar35 = uVar20 + 7;
      pvVar25 = (void *)((long)pvVar25 + lVar40);
      pvVar39 = (void *)((long)pvVar39 + lVar40);
      pvVar32 = (void *)((long)pvVar32 + lVar40);
      pvVar19 = (void *)((long)pvVar19 + lVar40);
      uVar20 = uVar20 + 4;
    } while (uVar35 < (uint)outch);
  }
  piVar17 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}